

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O1

void CompressBinaryDump(char *file,uint head_size)

{
  FILE *pFVar1;
  ulong uVar2;
  void *__ptr;
  void *__ptr_00;
  int iVar3;
  uint32_t uncompressed_size;
  uLongf out_size;
  int local_3c;
  ulong local_38;
  
  pFVar1 = fopen(file,"r");
  fseek(pFVar1,0,2);
  uVar2 = ftell(pFVar1);
  fseek(pFVar1,0,0);
  iVar3 = (uint)uVar2 - head_size;
  if ((uint)uVar2 < head_size) {
    fclose(pFVar1);
    return;
  }
  __ptr = operator_new__(uVar2 & 0xffffffff);
  fread(__ptr,1,uVar2 & 0xffffffff,pFVar1);
  local_3c = iVar3;
  local_38 = compressBound(iVar3);
  __ptr_00 = operator_new__(local_38);
  iVar3 = compress2(__ptr_00,&local_38,(long)__ptr + (ulong)head_size,iVar3,9);
  if (iVar3 != 0) {
    CompressBinaryDump();
  }
  fclose(pFVar1);
  pFVar1 = fopen(file,"w");
  fwrite(__ptr,(ulong)head_size,1,pFVar1);
  fwrite(&local_3c,4,1,pFVar1);
  fwrite(__ptr_00,local_38,1,pFVar1);
  fclose(pFVar1);
  operator_delete__(__ptr);
  operator_delete__(__ptr_00);
  return;
}

Assistant:

void CompressBinaryDump(const char* file, unsigned int head_size)
{
	// for simplicity ... copy the file into memory again and compress it there
	FILE* p = fopen(file,"r");
	fseek(p,0,SEEK_END);
	const uint32_t size = ftell(p);
	fseek(p,0,SEEK_SET);

	if (size<head_size) {
		fclose(p);
		return;
	}

	uint8_t* data = new uint8_t[size];
	fread(data,1,size,p);

	uint32_t uncompressed_size = size-head_size;
	uLongf out_size = (uLongf)compressBound(uncompressed_size);
	uint8_t* out = new uint8_t[out_size];

	int res = compress2(out,&out_size,data+head_size,uncompressed_size,9);
	if(res != Z_OK)
		fprintf(stderr, "compress2: error\n");
	fclose(p);
	p = fopen(file,"w");

	fwrite(data,head_size,1,p);
	fwrite(&uncompressed_size,4,1,p); // write size of uncompressed data
	fwrite(out,out_size,1,p);

	fclose(p);
	delete[] data;
	delete[] out;
}